

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vfmsub231ss_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
    }
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((((pMyDisasm->Reserved_).REX.W_ == '\0') && ((pMyDisasm->Reserved_).EVEX.state != '\x01'))
         || (((pMyDisasm->Reserved_).EVEX.state == '\x01' && ((pMyDisasm->Reserved_).EVEX.W == '\0')
             ))) {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vfmsub231ss");
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vfmsub231sd");
      }
      ArgsVEX(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vfmsub231ss_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmsub231ss");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmsub231sd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}